

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void upb_MtDecoder_AssignHasbits(upb_MtDecoder *d)

{
  upb_MiniTable *puVar1;
  ulong uVar2;
  long lVar3;
  uint16_t uVar4;
  long lVar5;
  short sVar6;
  
  puVar1 = d->table;
  lVar3 = (ulong)puVar1->field_count_dont_copy_me__upb_internal_use_only * 0xc;
  uVar2 = 0x3f;
  lVar5 = 0;
  do {
    if (lVar3 - lVar5 == 0) {
      if (uVar2 < 0x80) {
        puVar1->required_count_dont_copy_me__upb_internal_use_only = (char)uVar2 + 0xc1;
        for (lVar5 = 0; lVar3 - lVar5 != 0; lVar5 = lVar5 + 0xc) {
          if (*(short *)((long)&puVar1->fields_dont_copy_me__upb_internal_use_only->
                                offset_dont_copy_me__upb_internal_use_only + lVar5) == 1) {
            uVar2 = uVar2 + 1;
            *(short *)((long)&puVar1->fields_dont_copy_me__upb_internal_use_only->presence + lVar5)
                 = (short)uVar2;
          }
        }
        uVar4 = 0;
        if (uVar2 != 0) {
          uVar4 = (uint16_t)((int)uVar2 + 8U >> 3);
        }
        puVar1->size_dont_copy_me__upb_internal_use_only = uVar4;
        return;
      }
      upb_MdDecoder_ErrorJmp(&d->base,"Too many required fields");
    }
    sVar6 = *(short *)((long)&puVar1->fields_dont_copy_me__upb_internal_use_only->
                              offset_dont_copy_me__upb_internal_use_only + lVar5);
    if (sVar6 == 0) {
LAB_002505ff:
      *(short *)((long)&puVar1->fields_dont_copy_me__upb_internal_use_only->presence + lVar5) =
           sVar6;
    }
    else if (sVar6 == 2) {
      uVar2 = uVar2 + 1;
      sVar6 = (short)uVar2;
      goto LAB_002505ff;
    }
    lVar5 = lVar5 + 0xc;
  } while( true );
}

Assistant:

static void upb_MtDecoder_AssignHasbits(upb_MtDecoder* d) {
  upb_MiniTable* ret = d->table;
  int n = ret->UPB_PRIVATE(field_count);
  size_t last_hasbit = kUpb_Reserved_Hasbits - 1;

  // First assign required fields, which must have the lowest hasbits.
  for (int i = 0; i < n; i++) {
    upb_MiniTableField* field =
        (upb_MiniTableField*)&ret->UPB_PRIVATE(fields)[i];
    if (field->UPB_PRIVATE(offset) == kRequiredPresence) {
      field->presence = ++last_hasbit;
    } else if (field->UPB_PRIVATE(offset) == kNoPresence) {
      field->presence = 0;
    }
  }
  if (last_hasbit > kUpb_Reserved_Hasbits + 63) {
    upb_MdDecoder_ErrorJmp(&d->base, "Too many required fields");
  }

  ret->UPB_PRIVATE(required_count) = last_hasbit - (kUpb_Reserved_Hasbits - 1);

  // Next assign non-required hasbit fields.
  for (int i = 0; i < n; i++) {
    upb_MiniTableField* field =
        (upb_MiniTableField*)&ret->UPB_PRIVATE(fields)[i];
    if (field->UPB_PRIVATE(offset) == kHasbitPresence) {
      field->presence = ++last_hasbit;
    }
  }

  ret->UPB_PRIVATE(size) =
      last_hasbit ? upb_MiniTable_DivideRoundUp(last_hasbit + 1, 8) : 0;
}